

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

word Dau_Dsd6ToTruth_rec(char *pStr,char **p,int *pMatches,word *pTruths)

{
  char cVar1;
  char cVar2;
  int iVar3;
  word wVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  char *pcVar13;
  word Temp [3];
  word Fanins [6];
  ulong local_88 [4];
  word local_68 [7];
  
  pcVar11 = *p;
  cVar1 = *pcVar11;
  if (cVar1 == '!') {
    *p = pcVar11 + 1;
    pcVar13 = pcVar11 + 1;
    bVar6 = *pcVar13 + 0x9f;
    pcVar11 = pcVar11 + 1;
    cVar2 = *pcVar13;
    if (bVar6 < 6) {
      return ~pTruths[bVar6];
    }
  }
  else {
    cVar2 = cVar1;
    if ((byte)(cVar1 + 0x9fU) < 6) {
      return pTruths[(byte)(cVar1 + 0x9fU)];
    }
  }
  if (cVar2 == '[') {
    iVar3 = pMatches[(long)pcVar11 - (long)pStr];
    if (pStr[iVar3] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x179,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    pcVar11 = pcVar11 + 1;
    *p = pcVar11;
    uVar8 = 0;
    while (pcVar11 < pStr + iVar3) {
      wVar4 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
      uVar8 = uVar8 ^ wVar4;
      pcVar11 = *p + 1;
      *p = pcVar11;
    }
    if (pcVar11 != pStr + iVar3) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x17c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
  }
  else {
    if (cVar2 == '<') {
      uVar8 = (long)pcVar11 - (long)pStr;
      lVar10 = (long)pMatches[uVar8];
      uVar12 = 0;
      if (pStr[lVar10 + 1] == '{') {
        pcVar13 = pStr + lVar10 + 1;
        *p = pcVar13;
        if ((*pcVar13 != '{') ||
           (pcVar13 = pStr + pMatches[(long)pcVar13 - (long)pStr], *pcVar13 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,0x18c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        pcVar9 = pStr + lVar10 + 2;
        *p = pcVar9;
        lVar10 = 0;
        if (pcVar9 < pcVar13) {
          lVar10 = 0;
          local_88[3] = uVar8;
          do {
            wVar4 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
            local_68[lVar10] = wVar4;
            pcVar9 = *p + 1;
            *p = pcVar9;
            lVar10 = lVar10 + 1;
            uVar8 = local_88[3];
          } while (pcVar9 < pcVar13);
        }
        uVar12 = (uint)lVar10;
        if (pcVar9 != pcVar13) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,399,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        lVar10 = (long)pMatches[uVar8];
        pTruths = local_68;
      }
      *p = pcVar11;
      if ((*pcVar11 != '<') || (pcVar13 = pStr + lVar10, *pcVar13 != '>')) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x197,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      pcVar9 = pcVar11;
      if (uVar12 != 0) {
        for (; pcVar9 < pcVar13; pcVar9 = pcVar9 + 1) {
          if (((byte)(*pcVar9 + 0x9fU) < 0x1a) && (uVar12 <= (byte)(*pcVar9 + 0x9fU))) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0x19c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
          }
        }
      }
      *p = pcVar11 + 1;
      if (pcVar11 + 1 < pcVar13) {
        lVar10 = 0;
        do {
          wVar4 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
          *(word *)((long)local_88 + lVar10) = wVar4;
          lVar10 = lVar10 + 8;
          pcVar9 = *p;
          pcVar11 = pcVar9 + 1;
          *p = pcVar11;
        } while (pcVar11 < pcVar13);
        if (lVar10 == 0x18) {
          if (pcVar11 != pcVar13) {
            __assert_fail("*p == q",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0x1a1,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
          }
          if (pcVar13[1] == '{') {
            *p = pcVar9 + 2;
            if ((pcVar9[2] != '{') || (pStr[pMatches[(long)(pcVar9 + 2) - (long)pStr]] != '}')) {
              __assert_fail("**p == \'{\' && *q == \'}\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                            ,0x1a5,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
            }
            *p = pStr + pMatches[(long)(pcVar9 + 2) - (long)pStr];
          }
          return -(ulong)(cVar1 == '!') ^ local_88[2] ^ (local_88[1] ^ local_88[2]) & local_88[0];
        }
      }
      __assert_fail("pTemp == Temp + 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x1a0,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    if (cVar2 != '(') {
      if (5 < (byte)(cVar2 + 0xbfU) && 9 < (byte)(cVar2 - 0x30U)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1ba,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      iVar3 = Abc_TtReadHex(local_88,pcVar11);
      iVar7 = 1 << ((char)iVar3 - 2U & 0x1f);
      if (iVar3 < 3) {
        iVar7 = 1;
      }
      pcVar13 = *p;
      pcVar11 = pcVar13 + iVar7;
      *p = pcVar11;
      if ((pcVar13[iVar7] != '{') ||
         (pcVar13 = pStr + pMatches[(long)pcVar11 - (long)pStr], *pcVar13 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b2,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      pcVar11 = pcVar11 + 1;
      *p = pcVar11;
      lVar10 = 0;
      if (pcVar11 < pcVar13) {
        lVar10 = 0;
        do {
          wVar4 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
          local_68[lVar10] = wVar4;
          pcVar11 = *p + 1;
          *p = pcVar11;
          lVar10 = lVar10 + 1;
        } while (pcVar11 < pcVar13);
      }
      if ((int)lVar10 != iVar3) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b5,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (pcVar11 != pcVar13) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b6,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      uVar5 = Dau_Dsd6TruthCompose_rec(local_88[0],local_68,iVar3);
      uVar8 = -(ulong)(cVar1 == '!');
      goto LAB_004b9df3;
    }
    iVar3 = pMatches[(long)pcVar11 - (long)pStr];
    if (pStr[iVar3] != ')') {
      __assert_fail("**p == \'(\' && *q == \')\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x16f,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    pcVar11 = pcVar11 + 1;
    *p = pcVar11;
    uVar8 = 0xffffffffffffffff;
    while (pcVar11 < pStr + iVar3) {
      wVar4 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
      uVar8 = uVar8 & wVar4;
      pcVar11 = *p + 1;
      *p = pcVar11;
    }
    if (pcVar11 != pStr + iVar3) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x172,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
  }
  uVar5 = -(ulong)(cVar1 == '!');
LAB_004b9df3:
  return uVar8 ^ uVar5;
}

Assistant:

word Dau_Dsd6ToTruth_rec( char * pStr, char ** p, int * pMatches, word * pTruths )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p <= 'f' ) // var
    {
        assert( **p - 'a' >= 0 && **p - 'a' < 6 );
        return fCompl ? ~pTruths[**p - 'a'] : pTruths[**p - 'a'];
    }
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word Res = ~(word)0;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
            Res &= Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( *p == q );
        return fCompl ? ~Res : Res;
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word Res = 0;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
            Res ^= Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( *p == q );
        return fCompl ? ~Res : Res;
    }
    if ( **p == '<' ) // mux
    {
        int nVars = 0;
        word Temp[3], * pTemp = Temp, Res;
        word Fanins[6], * pTruths2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
            assert( *p == q2 );
            pTruths2 = Fanins;
        }
        else
            pTruths2 = pTruths;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MAX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths2 );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        Res = (Temp[0] & Temp[1]) | (~Temp[0] & Temp[2]);
        return fCompl ? ~Res : Res;
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word Func, Fanins[6], Res;
        char * q;
        int i, nVars = Abc_TtReadHex( &Func, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( i == nVars );
        assert( *p == q );
        Res = Dau_Dsd6TruthCompose_rec( Func, Fanins, nVars );
        return fCompl ? ~Res : Res;
    }
    assert( 0 );
    return 0;
}